

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void pbrt::DisplayDynamic
               (string *title,Point2i *resolution,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *channelNames,
               function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  Tuple2<pbrt::Point2,_int> resolution_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_d8;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> local_c0;
  DisplayItem local_a0;
  
  std::mutex::lock((mutex *)mutex);
  resolution_00 = resolution->super_Tuple2<pbrt::Point2,_int>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_d8,channelNames);
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function
            (&local_c0,getTileValues);
  DisplayItem::DisplayItem(&local_a0,title,(Point2i)resolution_00,&vStack_d8,&local_c0);
  std::vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_>::
  emplace_back<pbrt::DisplayItem>
            ((vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_> *)&dynamicItems,
             &local_a0);
  DisplayItem::~DisplayItem(&local_a0);
  std::_Function_base::~_Function_base(&local_c0.super__Function_base);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_d8);
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  return;
}

Assistant:

void DisplayDynamic(
    const std::string &title, const Point2i &resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues) {
    std::lock_guard<std::mutex> lock(mutex);
    dynamicItems.push_back(DisplayItem(title, resolution, channelNames, getTileValues));
}